

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_ptr<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,unsigned_long value,
          basic_format_specs<char16_t> *specs)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char16_t *pcVar5;
  buffer<char16_t> *buf;
  unsigned_long uVar6;
  bool bVar7;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_38;
  char local_28 [32];
  
  sVar2 = 2;
  uVar6 = value;
  do {
    sVar1 = sVar2;
    sVar2 = sVar1 + 1;
    bVar7 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar7);
  local_38.num_digits = (int)sVar1 + -1;
  local_38.value = value;
  if (specs == (basic_format_specs<char16_t> *)0x0) {
    if ((out.container)->capacity_ < (out.container)->size_ + 1) {
      (**(out.container)->_vptr_buffer)(out.container);
    }
    sVar2 = (out.container)->size_;
    (out.container)->size_ = sVar2 + 1;
    (out.container)->ptr_[sVar2] = L'0';
    if ((out.container)->capacity_ < sVar2 + 2) {
      (**(out.container)->_vptr_buffer)(out.container);
    }
    pcVar5 = (out.container)->ptr_;
    sVar1 = (out.container)->size_;
    sVar2 = sVar1 + 1;
    (out.container)->size_ = sVar2;
    pcVar5[sVar1] = L'x';
    lVar3 = (long)local_38.num_digits;
    if (lVar3 < 0) {
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
    if ((out.container)->capacity_ < sVar2 + lVar3) {
      pcVar5 = (char16_t *)0x0;
    }
    else {
      (out.container)->size_ = sVar2 + lVar3;
      pcVar5 = pcVar5 + sVar2;
    }
    if (pcVar5 == (char16_t *)0x0) {
      pcVar4 = local_28 + lVar3 + -1;
      uVar6 = local_38.value;
      do {
        *pcVar4 = "0123456789abcdef"[(uint)uVar6 & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar7 = 0xf < uVar6;
        uVar6 = uVar6 >> 4;
      } while (bVar7);
      out = copy_str_noinline<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (local_28,local_28 + lVar3,out);
    }
    else {
      pcVar5 = pcVar5 + lVar3;
      do {
        pcVar5 = pcVar5 + -1;
        *pcVar5 = (short)"0123456789abcdef"[(uint)local_38.value & 0xf];
        bVar7 = 0xf < local_38.value;
        local_38.value = local_38.value >> 4;
      } while (bVar7);
    }
  }
  else {
    out = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_ptr<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long,fmt::v8::basic_format_specs<char16_t>const*)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                    (out,specs,sVar2,sVar2,&local_38);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}